

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O2

uint If_DsdManCheckAndXor
               (If_DsdMan_t *p,int iFirst,uint uMaskNot,If_DsdObj_t *pObj,int nSuppAll,int LutSize,
               int fDerive,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int *piVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong local_148;
  ulong local_140;
  ulong local_138;
  int *local_130;
  int *local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  int *local_e0;
  ulong local_d8;
  ulong local_d0;
  int *local_c8;
  int *local_c0;
  int pFirsts [12];
  int pSSizes [12];
  
  uVar1 = *(uint *)&pObj->field_0x4;
  if (uVar1 < 0x18000000) {
    __assert_fail("pObj->nFans > 2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x6f6,
                  "unsigned int If_DsdManCheckAndXor(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                 );
  }
  if ((int)(uVar1 >> 3 & 0x1f) <= LutSize) {
    __assert_fail("If_DsdObjSuppSize(pObj) > LutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x6f7,
                  "unsigned int If_DsdManCheckAndXor(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                 );
  }
  If_DsdManGetSuppSizes(p,pObj,pSSizes);
  iVar7 = ~nSuppAll + LutSize + (*(uint *)&pObj->field_0x4 >> 3 & 0x1f);
  if (LutSize <= iVar7) {
    __assert_fail("LimitOut < LutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                  ,0x6fa,
                  "unsigned int If_DsdManCheckAndXor(If_DsdMan_t *, int, unsigned int, If_DsdObj_t *, int, int, int, int)"
                 );
  }
  uVar11 = (ulong)(uVar1 >> 0x1b);
  uVar13 = 1;
  uVar6 = 0;
  do {
    if (uVar6 == uVar11) {
      if ((*(uint *)&pObj->field_0x4 & 0xf8000000) != 0x18000000) {
        local_138 = 2;
        local_140 = 1;
        uVar13 = 0;
        while (uVar13 != uVar11) {
          uVar6 = local_140;
          uVar12 = local_138;
          while (uVar6 < uVar11) {
            for (uVar9 = uVar12; uVar9 < uVar11; uVar9 = uVar9 + 1) {
              iVar3 = pSSizes[uVar6] + pSSizes[uVar13] + pSSizes[uVar9];
              if ((iVar3 <= LutSize) &&
                 ((int)((*(uint *)&pObj->field_0x4 >> 3 & 0x1f) - iVar3) <= iVar7)) {
                if (fDerive == 0) {
                  return 0xffffffff;
                }
                If_DsdManComputeFirst(p,pObj,pFirsts);
                uVar1 = If_DsdSign(p,pObj,(int)uVar13,pFirsts[uVar13] + iFirst,0);
                uVar2 = If_DsdSign(p,pObj,(int)uVar6,pFirsts[uVar6] + iFirst,0);
                uVar4 = If_DsdSign(p,pObj,(int)uVar9,pFirsts[uVar9] + iFirst,0);
                uVar4 = uVar4 | uVar2 | uVar1;
                if ((uMaskNot & uVar4) == 0) {
                  return uVar4;
                }
              }
            }
            uVar12 = uVar12 + 1;
            uVar6 = uVar6 + 1;
          }
          local_138 = local_138 + 1;
          local_140 = local_140 + 1;
          uVar13 = uVar13 + 1;
        }
        if ((*(uint *)&pObj->field_0x4 & 0xf8000000) != 0x20000000) {
          local_e0 = pSSizes + 3;
          local_e8 = 3;
          local_f0 = 2;
          local_f8 = 1;
          local_100 = pFirsts + 3;
          uVar13 = 0;
          while (uVar13 != uVar11) {
            local_c0 = local_100;
            local_c8 = local_e0;
            local_d0 = local_f0;
            local_d8 = local_e8;
            uVar6 = local_f8;
            while (uVar6 < uVar11) {
              local_130 = local_c0;
              local_148 = local_d8;
              piVar8 = local_c8;
              uVar12 = local_d0;
              while (uVar12 < uVar11) {
                lVar10 = 0;
                for (uVar9 = local_148; uVar9 < uVar11; uVar9 = uVar9 + 1) {
                  iVar3 = pSSizes[uVar6] + pSSizes[uVar13] + pSSizes[uVar12] +
                          *(int *)((long)piVar8 + lVar10);
                  if ((iVar3 <= LutSize) &&
                     ((int)((*(uint *)&pObj->field_0x4 >> 3 & 0x1f) - iVar3) <= iVar7)) {
                    if (fDerive == 0) {
                      return 0xffffffff;
                    }
                    If_DsdManComputeFirst(p,pObj,pFirsts);
                    uVar1 = If_DsdSign(p,pObj,(int)uVar13,pFirsts[uVar13] + iFirst,0);
                    uVar2 = If_DsdSign(p,pObj,(int)uVar6,pFirsts[uVar6] + iFirst,0);
                    uVar4 = If_DsdSign(p,pObj,(int)uVar12,pFirsts[uVar12] + iFirst,0);
                    uVar5 = If_DsdSign(p,pObj,(int)uVar9,*(int *)((long)local_130 + lVar10) + iFirst
                                       ,0);
                    uVar1 = uVar5 | uVar4 | uVar2 | uVar1;
                    if ((uMaskNot & uVar1) == 0) {
                      return uVar1;
                    }
                  }
                  lVar10 = lVar10 + 4;
                }
                local_148 = local_148 + 1;
                piVar8 = piVar8 + 1;
                local_130 = local_130 + 1;
                uVar12 = uVar12 + 1;
              }
              local_d8 = local_d8 + 1;
              local_d0 = local_d0 + 1;
              local_c8 = local_c8 + 1;
              local_c0 = local_c0 + 1;
              uVar6 = uVar6 + 1;
            }
            local_e8 = local_e8 + 1;
            local_f0 = local_f0 + 1;
            local_f8 = local_f8 + 1;
            local_e0 = local_e0 + 1;
            local_100 = local_100 + 1;
            uVar13 = uVar13 + 1;
          }
        }
      }
      return 0;
    }
    for (uVar12 = uVar13; uVar12 < uVar11; uVar12 = uVar12 + 1) {
      if ((pSSizes[uVar12] + pSSizes[uVar6] <= LutSize) &&
         ((int)((*(uint *)&pObj->field_0x4 >> 3 & 0x1f) - (pSSizes[uVar12] + pSSizes[uVar6])) <=
          iVar7)) {
        if (fDerive == 0) {
          return 0xffffffff;
        }
        If_DsdManComputeFirst(p,pObj,pFirsts);
        uVar1 = If_DsdSign(p,pObj,(int)uVar6,pFirsts[uVar6] + iFirst,0);
        uVar2 = If_DsdSign(p,pObj,(int)uVar12,pFirsts[uVar12] + iFirst,0);
        if ((uMaskNot & (uVar2 | uVar1)) == 0) {
          return uVar2 | uVar1;
        }
      }
    }
    uVar13 = uVar13 + 1;
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

unsigned If_DsdManCheckAndXor( If_DsdMan_t * p, int iFirst, unsigned uMaskNot, If_DsdObj_t * pObj, int nSuppAll, int LutSize, int fDerive, int fVerbose )
{
    int i[6], LimitOut, SizeIn, SizeOut, pSSizes[DAU_MAX_VAR];
    int nFans = If_DsdObjFaninNum(pObj), pFirsts[DAU_MAX_VAR];
    unsigned uRes;
    assert( pObj->nFans > 2 );
    assert( If_DsdObjSuppSize(pObj) > LutSize );
    If_DsdManGetSuppSizes( p, pObj, pSSizes );
    LimitOut = LutSize - (nSuppAll - pObj->nSupp + 1);
    assert( LimitOut < LutSize );
    for ( i[0] = 0;      i[0] < nFans; i[0]++ )
    for ( i[1] = i[0]+1; i[1] < nFans; i[1]++ )
    {
        SizeIn = pSSizes[i[0]] + pSSizes[i[1]];
        SizeOut = pObj->nSupp - SizeIn;
        if ( SizeIn > LutSize || SizeOut > LimitOut )
            continue;
        if ( !fDerive )
            return ~0;
        If_DsdManComputeFirst( p, pObj, pFirsts );
        uRes = If_DsdSign(p, pObj, i[0], iFirst + pFirsts[i[0]], 0) | 
               If_DsdSign(p, pObj, i[1], iFirst + pFirsts[i[1]], 0);
        if ( uRes & uMaskNot )
            continue;
        return uRes;
    }
    if ( pObj->nFans == 3 )
        return 0;
    for ( i[0] = 0;      i[0] < nFans; i[0]++ )
    for ( i[1] = i[0]+1; i[1] < nFans; i[1]++ )
    for ( i[2] = i[1]+1; i[2] < nFans; i[2]++ )
    {
        SizeIn = pSSizes[i[0]] + pSSizes[i[1]] + pSSizes[i[2]];
        SizeOut = pObj->nSupp - SizeIn;
        if ( SizeIn > LutSize || SizeOut > LimitOut )
            continue;
        if ( !fDerive )
            return ~0;
        If_DsdManComputeFirst( p, pObj, pFirsts );
        uRes = If_DsdSign(p, pObj, i[0], iFirst + pFirsts[i[0]], 0) | 
               If_DsdSign(p, pObj, i[1], iFirst + pFirsts[i[1]], 0) | 
               If_DsdSign(p, pObj, i[2], iFirst + pFirsts[i[2]], 0);
        if ( uRes & uMaskNot )
            continue;
        return uRes;
    }
    if ( pObj->nFans == 4 )
        return 0;
    for ( i[0] = 0;      i[0] < nFans; i[0]++ )
    for ( i[1] = i[0]+1; i[1] < nFans; i[1]++ )
    for ( i[2] = i[1]+1; i[2] < nFans; i[2]++ )
    for ( i[3] = i[2]+1; i[3] < nFans; i[3]++ )
    {
        SizeIn = pSSizes[i[0]] + pSSizes[i[1]] + pSSizes[i[2]] + pSSizes[i[3]];
        SizeOut = pObj->nSupp - SizeIn;
        if ( SizeIn > LutSize || SizeOut > LimitOut )
            continue;
        if ( !fDerive )
            return ~0;
        If_DsdManComputeFirst( p, pObj, pFirsts );
        uRes = If_DsdSign(p, pObj, i[0], iFirst + pFirsts[i[0]], 0) | 
               If_DsdSign(p, pObj, i[1], iFirst + pFirsts[i[1]], 0) | 
               If_DsdSign(p, pObj, i[2], iFirst + pFirsts[i[2]], 0) | 
               If_DsdSign(p, pObj, i[3], iFirst + pFirsts[i[3]], 0);
        if ( uRes & uMaskNot )
            continue;
        return uRes;
    }
    return 0;
}